

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O0

ngx_int_t ngx_parse_inet6_url(ngx_pool_t *pool,ngx_url_t *u)

{
  undefined8 uVar1;
  uint16_t uVar2;
  u_char *puVar3;
  u_char *puVar4;
  u_char *puVar5;
  u_char *puVar6;
  ngx_int_t nVar7;
  size_t len_00;
  ngx_addr_t *pnVar8;
  sockaddr *psVar9;
  u_char *puVar10;
  bool bVar11;
  in6_addr *__a;
  sockaddr_in6 *sin6;
  ngx_int_t n;
  size_t len;
  u_char *uri;
  u_char *last;
  u_char *port;
  u_char *host;
  u_char *p;
  ngx_url_t *u_local;
  ngx_pool_t *pool_local;
  
  u->socklen = 0x1c;
  (u->sockaddr).sockaddr.sa_family = 10;
  puVar10 = (u->url).data;
  puVar3 = puVar10 + 1;
  uri = (u->url).data + (u->url).len;
  puVar4 = ngx_strlchr(puVar3,uri,']');
  if (puVar4 == (u_char *)0x0) {
    u->err = "invalid host";
    return -1;
  }
  puVar5 = puVar4 + 1;
  puVar6 = ngx_strlchr(puVar5,uri,'/');
  if (puVar6 != (u_char *)0x0) {
    if (((u->field_0x48 & 1) != 0) || (((byte)u->field_0x48 >> 1 & 1) == 0)) {
      u->err = "invalid host";
      return -1;
    }
    (u->uri).len = (long)uri - (long)puVar6;
    (u->uri).data = puVar6;
    uri = puVar6;
  }
  if (puVar5 < uri) {
    if (*puVar5 != ':') {
      u->err = "invalid host";
      return -1;
    }
    puVar5 = puVar4 + 2;
    nVar7 = ngx_atoi(puVar5,(long)uri - (long)puVar5);
    if ((nVar7 < 1) || (0xffff < nVar7)) {
      u->err = "invalid port";
      return -1;
    }
    u->port = (uint16_t)nVar7;
    uVar2 = htons((uint16_t)nVar7);
    (u->sockaddr).sockaddr_in.sin_port = uVar2;
    (u->port_text).len = (long)uri - (long)puVar5;
    (u->port_text).data = puVar5;
  }
  else {
    u->field_0x48 = u->field_0x48 & 0xf7 | 8;
    u->port = u->default_port;
    uVar2 = htons(u->default_port);
    (u->sockaddr).sockaddr_in.sin_port = uVar2;
  }
  len_00 = (long)puVar4 - (long)puVar3;
  if (len_00 == 0) {
    u->err = "no host";
    pool_local = (ngx_pool_t *)0xffffffffffffffff;
  }
  else {
    (u->host).len = len_00 + 2;
    (u->host).data = puVar10;
    nVar7 = ngx_inet6_addr(puVar3,len_00,(u->sockaddr).sockaddr_in.sin_zero);
    if (nVar7 == 0) {
      bVar11 = false;
      if (((*(int *)((long)&u->sockaddr + 8) == 0) &&
          (bVar11 = false, *(int *)((long)&u->sockaddr + 0xc) == 0)) &&
         (bVar11 = false, *(int *)((long)&u->sockaddr + 0x10) == 0)) {
        bVar11 = *(int *)((long)&u->sockaddr + 0x14) == 0;
      }
      if (bVar11) {
        u->field_0x48 = u->field_0x48 & 0xef | 0x10;
      }
      u->family = 10;
      u->naddrs = 1;
      pnVar8 = (ngx_addr_t *)ngx_pcalloc(pool,0x20);
      u->addrs = pnVar8;
      if (u->addrs == (ngx_addr_t *)0x0) {
        pool_local = (ngx_pool_t *)0xffffffffffffffff;
      }
      else {
        psVar9 = (sockaddr *)ngx_pcalloc(pool,0x1c);
        if (psVar9 == (sockaddr *)0x0) {
          pool_local = (ngx_pool_t *)0xffffffffffffffff;
        }
        else {
          uVar1 = *(undefined8 *)&u->sockaddr;
          psVar9->sa_family = (short)uVar1;
          psVar9->sa_data[0] = (char)((ulong)uVar1 >> 0x10);
          psVar9->sa_data[1] = (char)((ulong)uVar1 >> 0x18);
          psVar9->sa_data[2] = (char)((ulong)uVar1 >> 0x20);
          psVar9->sa_data[3] = (char)((ulong)uVar1 >> 0x28);
          psVar9->sa_data[4] = (char)((ulong)uVar1 >> 0x30);
          psVar9->sa_data[5] = (char)((ulong)uVar1 >> 0x38);
          *(undefined8 *)(psVar9->sa_data + 6) = *(undefined8 *)((long)&u->sockaddr + 8);
          uVar1 = *(undefined8 *)((long)&u->sockaddr + 0x10);
          psVar9[1].sa_family = (short)uVar1;
          psVar9[1].sa_data[0] = (char)((ulong)uVar1 >> 0x10);
          psVar9[1].sa_data[1] = (char)((ulong)uVar1 >> 0x18);
          psVar9[1].sa_data[2] = (char)((ulong)uVar1 >> 0x20);
          psVar9[1].sa_data[3] = (char)((ulong)uVar1 >> 0x28);
          psVar9[1].sa_data[4] = (char)((ulong)uVar1 >> 0x30);
          psVar9[1].sa_data[5] = (char)((ulong)uVar1 >> 0x38);
          *(uint32_t *)(psVar9[1].sa_data + 6) = (u->sockaddr).sockaddr_in6.sin6_scope_id;
          u->addrs->sockaddr = psVar9;
          u->addrs->socklen = 0x1c;
          puVar10 = (u_char *)ngx_pnalloc(pool,(u->host).len + 6);
          if (puVar10 == (u_char *)0x0) {
            pool_local = (ngx_pool_t *)0xffffffffffffffff;
          }
          else {
            puVar3 = ngx_sprintf(puVar10,"%V:%d",&u->host,(ulong)u->port);
            (u->addrs->name).len = (long)puVar3 - (long)puVar10;
            (u->addrs->name).data = puVar10;
            pool_local = (ngx_pool_t *)0x0;
          }
        }
      }
    }
    else {
      u->err = "invalid IPv6 address";
      pool_local = (ngx_pool_t *)0xffffffffffffffff;
    }
  }
  return (ngx_int_t)pool_local;
}

Assistant:

static ngx_int_t
ngx_parse_inet6_url(ngx_pool_t *pool, ngx_url_t *u)
{
#if (NGX_HAVE_INET6)
    u_char               *p, *host, *port, *last, *uri;
    size_t                len;
    ngx_int_t             n;
    struct sockaddr_in6  *sin6;

    u->socklen = sizeof(struct sockaddr_in6);
    sin6 = (struct sockaddr_in6 *) &u->sockaddr;
    sin6->sin6_family = AF_INET6;

    host = u->url.data + 1;

    last = u->url.data + u->url.len;

    p = ngx_strlchr(host, last, ']');

    if (p == NULL) {
        u->err = "invalid host";
        return NGX_ERROR;
    }

    port = p + 1;

    uri = ngx_strlchr(port, last, '/');

    if (uri) {
        if (u->listen || !u->uri_part) {
            u->err = "invalid host";
            return NGX_ERROR;
        }

        u->uri.len = last - uri;
        u->uri.data = uri;

        last = uri;
    }

    if (port < last) {
        if (*port != ':') {
            u->err = "invalid host";
            return NGX_ERROR;
        }

        port++;

        len = last - port;

        n = ngx_atoi(port, len);

        if (n < 1 || n > 65535) {
            u->err = "invalid port";
            return NGX_ERROR;
        }

        u->port = (in_port_t) n;
        sin6->sin6_port = htons((in_port_t) n);

        u->port_text.len = len;
        u->port_text.data = port;

    } else {
        u->no_port = 1;
        u->port = u->default_port;
        sin6->sin6_port = htons(u->default_port);
    }

    len = p - host;

    if (len == 0) {
        u->err = "no host";
        return NGX_ERROR;
    }

    u->host.len = len + 2;
    u->host.data = host - 1;

    if (ngx_inet6_addr(host, len, sin6->sin6_addr.s6_addr) != NGX_OK) {
        u->err = "invalid IPv6 address";
        return NGX_ERROR;
    }

    if (IN6_IS_ADDR_UNSPECIFIED(&sin6->sin6_addr)) {
        u->wildcard = 1;
    }

    u->family = AF_INET6;
    u->naddrs = 1;

    u->addrs = ngx_pcalloc(pool, sizeof(ngx_addr_t));
    if (u->addrs == NULL) {
        return NGX_ERROR;
    }

    sin6 = ngx_pcalloc(pool, sizeof(struct sockaddr_in6));
    if (sin6 == NULL) {
        return NGX_ERROR;
    }

    ngx_memcpy(sin6, &u->sockaddr, sizeof(struct sockaddr_in6));

    u->addrs[0].sockaddr = (struct sockaddr *) sin6;
    u->addrs[0].socklen = sizeof(struct sockaddr_in6);

    p = ngx_pnalloc(pool, u->host.len + sizeof(":65535") - 1);
    if (p == NULL) {
        return NGX_ERROR;
    }

    u->addrs[0].name.len = ngx_sprintf(p, "%V:%d",
                                       &u->host, u->port) - p;
    u->addrs[0].name.data = p;

    return NGX_OK;

#else

    u->err = "the INET6 sockets are not supported on this platform";

    return NGX_ERROR;

#endif
}